

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O3

void __thiscall
xray_re::cse_alife_graph_point::state_read
          (cse_alife_graph_point *this,xr_packet *packet,uint16_t size)

{
  long lVar1;
  int value;
  undefined1 local_1c [4];
  
  xr_packet::r_sz(packet,&this->m_connection_point_name);
  if ((this->super_cse_abstract).m_version < 0x21) {
    xr_packet::r_raw(packet,local_1c,4);
  }
  else {
    xr_packet::r_sz(packet,&this->m_connection_level_name);
  }
  lVar1 = 0;
  do {
    xr_packet::r_raw(packet,this->m_locations + lVar1,1);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  return;
}

Assistant:

void cse_alife_graph_point::state_read(xr_packet& packet, uint16_t size)
{
	packet.r_sz(m_connection_point_name);
	if (m_version >= CSE_VERSION_0x21)
		packet.r_sz(m_connection_level_name);
	else
		packet.r_s32();
	packet.r_cseq(4, m_locations);
}